

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O3

void __thiscall
Imf_3_4::Header::Header
          (Header *this,Box2i *displayWindow,Box2i *dataWindow,float pixelAspectRatio,
          V2f *screenWindowCenter,float screenWindowWidth,LineOrder lineOrder,
          Compression compression)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->_map)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->_map)._M_t._M_impl = 0;
  *(undefined8 *)&(this->_map)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->_readsNothing = false;
  staticInitialize();
  anon_unknown_1::initialize
            (this,displayWindow,dataWindow,pixelAspectRatio,screenWindowCenter,screenWindowWidth,
             lineOrder,compression);
  return;
}

Assistant:

Header::Header (
    const Box2i& displayWindow,
    const Box2i& dataWindow,
    float        pixelAspectRatio,
    const V2f&   screenWindowCenter,
    float        screenWindowWidth,
    LineOrder    lineOrder,
    Compression  compression)
    : _map (), _readsNothing (false)
{
    staticInitialize ();

    initialize (
        *this,
        displayWindow,
        dataWindow,
        pixelAspectRatio,
        screenWindowCenter,
        screenWindowWidth,
        lineOrder,
        compression);
}